

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,uchar *tag,size_t tag_len)

{
  long lVar1;
  long lVar2;
  uint64_t orig_add_len;
  uint64_t orig_len;
  size_t i;
  uchar work_buf [16];
  size_t tag_len_local;
  uchar *tag_local;
  mbedtls_gcm_context *ctx_local;
  
  lVar1 = ctx->len << 3;
  lVar2 = ctx->add_len << 3;
  if ((tag_len < 0x11) && (3 < tag_len)) {
    work_buf._8_8_ = tag_len;
    memcpy(tag,ctx->base_ectr,tag_len);
    if ((lVar1 != 0) || (lVar2 != 0)) {
      memset(&i,0,0x10);
      i._0_1_ = (char)((ulong)lVar2 >> 0x38);
      i._1_1_ = (char)((ulong)lVar2 >> 0x30);
      i._2_1_ = (char)((ulong)lVar2 >> 0x28);
      i._3_1_ = (char)((ulong)lVar2 >> 0x20);
      i._4_1_ = (char)((ulong)lVar2 >> 0x18);
      i._5_1_ = (char)((ulong)lVar2 >> 0x10);
      i._6_1_ = (char)((ulong)lVar2 >> 8);
      i._7_1_ = (char)lVar2;
      work_buf[0] = (uchar)((ulong)lVar1 >> 0x38);
      work_buf[1] = (uchar)((ulong)lVar1 >> 0x30);
      work_buf[2] = (uchar)((ulong)lVar1 >> 0x28);
      work_buf[3] = (uchar)((ulong)lVar1 >> 0x20);
      work_buf[4] = (uchar)((ulong)lVar1 >> 0x18);
      work_buf[5] = (uchar)((ulong)lVar1 >> 0x10);
      work_buf[6] = (uchar)((ulong)lVar1 >> 8);
      work_buf[7] = (uchar)lVar1;
      for (orig_len = 0; orig_len < 0x10; orig_len = orig_len + 1) {
        ctx->buf[orig_len] = ctx->buf[orig_len] ^ work_buf[orig_len - 8];
      }
      gcm_mult(ctx,ctx->buf,ctx->buf);
      for (orig_len = 0; orig_len < (ulong)work_buf._8_8_; orig_len = orig_len + 1) {
        tag[orig_len] = tag[orig_len] ^ ctx->buf[orig_len];
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -0x14;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_gcm_finish( mbedtls_gcm_context *ctx,
                unsigned char *tag,
                size_t tag_len )
{
    unsigned char work_buf[16];
    size_t i;
    uint64_t orig_len;
    uint64_t orig_add_len;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( tag != NULL );

    orig_len = ctx->len * 8;
    orig_add_len = ctx->add_len * 8;

    if( tag_len > 16 || tag_len < 4 )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    memcpy( tag, ctx->base_ectr, tag_len );

    if( orig_len || orig_add_len )
    {
        memset( work_buf, 0x00, 16 );

        PUT_UINT32_BE( ( orig_add_len >> 32 ), work_buf, 0  );
        PUT_UINT32_BE( ( orig_add_len       ), work_buf, 4  );
        PUT_UINT32_BE( ( orig_len     >> 32 ), work_buf, 8  );
        PUT_UINT32_BE( ( orig_len           ), work_buf, 12 );

        for( i = 0; i < 16; i++ )
            ctx->buf[i] ^= work_buf[i];

        gcm_mult( ctx, ctx->buf, ctx->buf );

        for( i = 0; i < tag_len; i++ )
            tag[i] ^= ctx->buf[i];
    }

    return( 0 );
}